

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkeng.cpp
# Opt level: O1

LanguageBreakEngine * __thiscall
icu_63::ICULanguageBreakFactory::loadEngineFor(ICULanguageBreakFactory *this,UChar32 c)

{
  uint in_EAX;
  UScriptCode UVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t size;
  ThaiBreakEngine *pTVar3;
  UErrorCode status;
  undefined8 uStack_28;
  ThaiBreakEngine *adoptDictionary;
  
  uStack_28 = (ulong)in_EAX;
  UVar1 = uscript_getScript_63(c,(UErrorCode *)((long)&uStack_28 + 4));
  if (0 < uStack_28._4_4_) {
    return (LanguageBreakEngine *)0x0;
  }
  size = (size_t)(uint)UVar1;
  iVar2 = (*(this->super_LanguageBreakFactory)._vptr_LanguageBreakFactory[4])(this);
  adoptDictionary = (ThaiBreakEngine *)CONCAT44(extraout_var,iVar2);
  if (adoptDictionary == (ThaiBreakEngine *)0x0) goto LAB_002dfd22;
  this = (ICULanguageBreakFactory *)0x0;
  switch(UVar1) {
  case USCRIPT_HAN:
  case USCRIPT_HIRAGANA:
  case USCRIPT_KATAKANA:
    this = (ICULanguageBreakFactory *)UMemory::operator_new((UMemory *)0x1d0,size);
    if ((ThaiBreakEngine *)this == (ThaiBreakEngine *)0x0) {
LAB_002dfd06:
      this = (ICULanguageBreakFactory *)0x0;
    }
    else {
      CjkBreakEngine::CjkBreakEngine
                ((CjkBreakEngine *)this,(DictionaryMatcher *)adoptDictionary,kChineseJapanese,
                 (UErrorCode *)((long)&uStack_28 + 4));
    }
    break;
  case USCRIPT_HANGUL:
    this = (ICULanguageBreakFactory *)UMemory::operator_new((UMemory *)0x1d0,size);
    if ((ThaiBreakEngine *)this == (ThaiBreakEngine *)0x0) goto LAB_002dfd06;
    CjkBreakEngine::CjkBreakEngine
              ((CjkBreakEngine *)this,(DictionaryMatcher *)adoptDictionary,kKorean,
               (UErrorCode *)((long)&uStack_28 + 4));
    break;
  case USCRIPT_HEBREW:
  case USCRIPT_KANNADA:
  case USCRIPT_LATIN:
  case USCRIPT_MALAYALAM:
  case USCRIPT_MONGOLIAN:
    break;
  case USCRIPT_KHMER:
    this = (ICULanguageBreakFactory *)UMemory::operator_new((UMemory *)0x1c8,size);
    if ((ThaiBreakEngine *)this == (ThaiBreakEngine *)0x0) goto LAB_002dfd06;
    KhmerBreakEngine::KhmerBreakEngine
              ((KhmerBreakEngine *)this,(DictionaryMatcher *)adoptDictionary,
               (UErrorCode *)((long)&uStack_28 + 4));
    break;
  case USCRIPT_LAO:
    this = (ICULanguageBreakFactory *)UMemory::operator_new((UMemory *)0x1c8,size);
    if ((ThaiBreakEngine *)this == (ThaiBreakEngine *)0x0) goto LAB_002dfd06;
    LaoBreakEngine::LaoBreakEngine
              ((LaoBreakEngine *)this,(DictionaryMatcher *)adoptDictionary,
               (UErrorCode *)((long)&uStack_28 + 4));
    break;
  case USCRIPT_MYANMAR:
    this = (ICULanguageBreakFactory *)UMemory::operator_new((UMemory *)0x1c8,size);
    if ((ThaiBreakEngine *)this == (ThaiBreakEngine *)0x0) goto LAB_002dfd06;
    BurmeseBreakEngine::BurmeseBreakEngine
              ((BurmeseBreakEngine *)this,(DictionaryMatcher *)adoptDictionary,
               (UErrorCode *)((long)&uStack_28 + 4));
    break;
  default:
    if (UVar1 == USCRIPT_THAI) {
      this = (ICULanguageBreakFactory *)UMemory::operator_new((UMemory *)0x220,size);
      if ((ThaiBreakEngine *)this == (ThaiBreakEngine *)0x0) goto LAB_002dfd06;
      ThaiBreakEngine::ThaiBreakEngine
                ((ThaiBreakEngine *)this,(DictionaryMatcher *)adoptDictionary,
                 (UErrorCode *)((long)&uStack_28 + 4));
    }
  }
  pTVar3 = adoptDictionary;
  if (((ThaiBreakEngine *)this == (ThaiBreakEngine *)0x0) ||
     (pTVar3 = (ThaiBreakEngine *)this, 0 < uStack_28._4_4_)) {
    (*(pTVar3->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine[1])
              (pTVar3);
    this = (ICULanguageBreakFactory *)0x0;
  }
LAB_002dfd22:
  if (adoptDictionary == (ThaiBreakEngine *)0x0) {
    return (LanguageBreakEngine *)0x0;
  }
  return (LanguageBreakEngine *)(ThaiBreakEngine *)this;
}

Assistant:

const LanguageBreakEngine *
ICULanguageBreakFactory::loadEngineFor(UChar32 c) {
    UErrorCode status = U_ZERO_ERROR;
    UScriptCode code = uscript_getScript(c, &status);
    if (U_SUCCESS(status)) {
        DictionaryMatcher *m = loadDictionaryMatcherFor(code);
        if (m != NULL) {
            const LanguageBreakEngine *engine = NULL;
            switch(code) {
            case USCRIPT_THAI:
                engine = new ThaiBreakEngine(m, status);
                break;
            case USCRIPT_LAO:
                engine = new LaoBreakEngine(m, status);
                break;
            case USCRIPT_MYANMAR:
                engine = new BurmeseBreakEngine(m, status);
                break;
            case USCRIPT_KHMER:
                engine = new KhmerBreakEngine(m, status);
                break;

#if !UCONFIG_NO_NORMALIZATION
                // CJK not available w/o normalization
            case USCRIPT_HANGUL:
                engine = new CjkBreakEngine(m, kKorean, status);
                break;

            // use same BreakEngine and dictionary for both Chinese and Japanese
            case USCRIPT_HIRAGANA:
            case USCRIPT_KATAKANA:
            case USCRIPT_HAN:
                engine = new CjkBreakEngine(m, kChineseJapanese, status);
                break;
#if 0
            // TODO: Have to get some characters with script=common handled
            // by CjkBreakEngine (e.g. U+309B). Simply subjecting
            // them to CjkBreakEngine does not work. The engine has to
            // special-case them.
            case USCRIPT_COMMON:
            {
                UBlockCode block = ublock_getCode(code);
                if (block == UBLOCK_HIRAGANA || block == UBLOCK_KATAKANA)
                   engine = new CjkBreakEngine(dict, kChineseJapanese, status);
                break;
            }
#endif
#endif

            default:
                break;
            }
            if (engine == NULL) {
                delete m;
            }
            else if (U_FAILURE(status)) {
                delete engine;
                engine = NULL;
            }
            return engine;
        }
    }
    return NULL;
}